

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_load.c
# Opt level: O1

int cmd_load_dep(yl_opt *yo,int posc)

{
  byte *pbVar1;
  
  if ((posc == 0) && (yo->interactive != '\0')) {
    puts(
        "Usage: load [-i] <module-name1>[@<revision>] [<module-name2>[@revision] ...]\n                  Add a new module of the specified name, yanglint will find\n                  them in searchpaths. If the <revision> of the module not\n                  specified, the latest revision available is loaded.\n\n  -F FEATURES, --features=FEATURES\n                  Features to support, default all in all implemented modules.\n                  <modname>:[<feature>,]*\n  -i, --make-implemented\n                  Make the imported modules \"referenced\" from any loaded\n                  <schema> module also implemented. If specified a second time,\n                  all the modules are set implemented.\n  -X, --extended-leafref\n                  Allow usage of deref() XPath function within leafref."
        );
    return 1;
  }
  if ((yo->schema_features).count != 0) {
    return 0;
  }
  pbVar1 = (byte *)((long)&yo->ctx_options + 1);
  *pbVar1 = *pbVar1 | 1;
  return 0;
}

Assistant:

int
cmd_load_dep(struct yl_opt *yo, int posc)
{
    if (yo->interactive && !posc) {
        /* no argument */
        cmd_load_help();
        return 1;
    }

    if (!yo->schema_features.count) {
        /* no features, enable all of them */
        yo->ctx_options |= LY_CTX_ENABLE_IMP_FEATURES;
    }

    return 0;
}